

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_relation.cpp
# Opt level: O2

string * __thiscall
duckdb::AggregateRelation::ToString_abi_cxx11_
          (string *__return_storage_ptr__,AggregateRelation *this,idx_t depth)

{
  reference this_00;
  pointer pPVar1;
  Relation *pRVar2;
  idx_t i;
  ulong __n;
  string str;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  Relation::RenderWhitespace_abi_cxx11_(&local_70,(Relation *)depth,depth);
  ::std::operator+(&local_50,&local_70,"Aggregate [");
  ::std::__cxx11::string::~string((string *)&local_70);
  for (__n = 0; __n < (ulong)((long)(this->expressions).
                                    super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                                    .
                                    super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(this->expressions).
                                    super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                                    .
                                    super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 3); __n = __n + 1)
  {
    if (__n != 0) {
      ::std::__cxx11::string::append((char *)&local_50);
    }
    this_00 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
              ::get<true>(&this->expressions,__n);
    pPVar1 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
             ::operator->(this_00);
    (*(pPVar1->super_BaseExpression)._vptr_BaseExpression[8])(&local_70,pPVar1);
    ::std::__cxx11::string::append((string *)&local_50);
    ::std::__cxx11::string::~string((string *)&local_70);
  }
  ::std::__cxx11::string::append((char *)&local_50);
  pRVar2 = shared_ptr<duckdb::Relation,_true>::operator->(&this->child);
  (*pRVar2->_vptr_Relation[6])(&local_70,pRVar2,depth + 1);
  ::std::operator+(__return_storage_ptr__,&local_50,&local_70);
  ::std::__cxx11::string::~string((string *)&local_70);
  ::std::__cxx11::string::~string((string *)&local_50);
  return __return_storage_ptr__;
}

Assistant:

string AggregateRelation::ToString(idx_t depth) {
	string str = RenderWhitespace(depth) + "Aggregate [";
	for (idx_t i = 0; i < expressions.size(); i++) {
		if (i != 0) {
			str += ", ";
		}
		str += expressions[i]->ToString();
	}
	str += "]\n";
	return str + child->ToString(depth + 1);
}